

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

int __thiscall CMU462::OSDText::init(OSDText *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  GLuint GVar2;
  GLint GVar3;
  ostream *poVar4;
  void *pvVar5;
  ulong __n;
  char *pcVar6;
  size_t size;
  string decoded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string encoded;
  bool use_hdpi_local;
  OSDText *this_local;
  
  encoded.field_2._M_local_buf[0xf] = (byte)ctx & 1;
  this->use_hdpi = (bool)encoded.field_2._M_local_buf[0xf];
  iVar1 = FT_Init_FreeType(this->ft);
  if (iVar1 == 0) {
    std::operator+(&local_c0,&osdfont_base64_1_abi_cxx11_,&osdfont_base64_2_abi_cxx11_);
    std::operator+(&local_a0,&local_c0,&osdfont_base64_3_abi_cxx11_);
    std::operator+(&local_80,&local_a0,&osdfont_base64_4_abi_cxx11_);
    std::operator+(&local_60,&local_80,&osdfont_base64_5_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&osdfont_base64_6_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    base64_decode((string *)&size,(string *)local_40);
    __n = std::__cxx11::string::size();
    pcVar6 = (char *)operator_new__(__n);
    this->font = pcVar6;
    pcVar6 = this->font;
    pvVar5 = (void *)std::__cxx11::string::c_str();
    memcpy(pcVar6,pvVar5,__n);
    iVar1 = FT_New_Memory_Face(*this->ft,this->font,__n,0,this->face);
    if (iVar1 == 0) {
      GVar2 = compile_shaders(this);
      this->program = GVar2;
      if (this->program == 0) {
        this_local._4_4_ = -1;
      }
      else {
        GVar3 = get_attribu(this,this->program,"coord");
        this->attribute_coord = GVar3;
        GVar3 = get_uniform(this,this->program,"tex");
        this->uniform_tex = GVar3;
        GVar3 = get_uniform(this,this->program,"color");
        this->uniform_color = GVar3;
        if (((this->attribute_coord == -1) || (this->uniform_tex == -1)) ||
           (this->uniform_color == -1)) {
          this_local._4_4_ = -1;
        }
        else {
          (*__glewGenBuffers)(1,&this->vbo);
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,this->font);
      poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
      poVar4 = std::operator<<(poVar4,"[CMU462] ");
      poVar4 = std::operator<<(poVar4,"\x1b[0m");
      poVar4 = std::operator<<(poVar4,"Cannot open font");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
      this_local._4_4_ = -1;
    }
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar4 = std::operator<<(poVar4,"[CMU462] ");
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"Cannot init freetype library");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int OSDText::init(bool use_hdpi) {

  this->use_hdpi = use_hdpi;

  // initialize font library
  if(FT_Init_FreeType(ft)) {
    out_err("Cannot init freetype library");
    return -1;
  }

  // decode font and keep in memory
  string encoded = osdfont_base64_1 + osdfont_base64_2 + osdfont_base64_3 
                    + osdfont_base64_4 + osdfont_base64_5 + osdfont_base64_6;
  string decoded = base64_decode(encoded);
  size_t size = decoded.size();
  font = new char[size];
  memcpy(font, decoded.c_str(), size);

  // initialize font face
  if(FT_New_Memory_Face(*ft, (const FT_Byte*) font, size, 0, face)) {
    cerr << font;
    out_err("Cannot open font");
    return -1;
  }

  // compile shaders
  program = compile_shaders();
  if(program) {
      attribute_coord = get_attribu ( program, "coord" );
      uniform_tex     = get_uniform ( program, "tex"   );
      uniform_color   = get_uniform ( program, "color" );
      if (attribute_coord == -1 || uniform_tex == -1 || uniform_color == -1) {
          return -1;
      }
  } else return -1;

  // create the vbo
  glGenBuffers(1, &vbo);

  return 0;
}